

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O3

MessageLite *
google::protobuf::internal::GetOwnedMessageInternal
          (Arena *message_arena,MessageLite *submessage,Arena *submessage_arena)

{
  Arena *pAVar1;
  MessageLite *this;
  internal local_20 [16];
  
  pAVar1 = (Arena *)(submessage->_internal_metadata_).ptr_;
  if (((ulong)pAVar1 & 1) != 0) {
    pAVar1 = *(Arena **)((ulong)pAVar1 & 0xfffffffffffffffe);
  }
  if (pAVar1 == submessage_arena) {
    if (submessage_arena != message_arena) {
      if (submessage_arena == (Arena *)0x0) {
        if (message_arena == (Arena *)0x0) {
          this = MessageLite::New(submessage,(Arena *)0x0);
          MessageLite::CheckTypeAndMergeFrom(this,submessage);
        }
        else {
          ThreadSafeArena::AddCleanup
                    (&message_arena->impl_,submessage,
                     arena_delete_object<google::protobuf::MessageLite>);
          this = submessage;
        }
        return this;
      }
      goto LAB_002d16fb;
    }
  }
  else {
    GetOwnedMessageInternal(local_20);
  }
  GetOwnedMessageInternal(local_20);
LAB_002d16fb:
  GetOwnedMessageInternal();
}

Assistant:

MessageLite* GetOwnedMessageInternal(Arena* message_arena,
                                     MessageLite* submessage,
                                     Arena* submessage_arena) {
  ABSL_DCHECK(submessage->GetArena() == submessage_arena);
  ABSL_DCHECK(message_arena != submessage_arena);
  ABSL_DCHECK_EQ(submessage_arena, nullptr);
  if (message_arena != nullptr && submessage_arena == nullptr) {
    message_arena->Own(submessage);
    return submessage;
  } else {
    MessageLite* ret = submessage->New(message_arena);
    ret->CheckTypeAndMergeFrom(*submessage);
    return ret;
  }
}